

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::section::Type<1,_451>::Type
          (Type<1,_451> *this,int zaid,double awr,int lrp,int lfi,int nlib,int nmod,double elis,
          double sta,int lis,int liso,int nfor,double awi,double emax,int lrel,int nsub,int nver,
          double temp,int ldrv,string *description,
          vector<njoy::ENDFtk::DirectoryRecord,_std::allocator<njoy::ENDFtk::DirectoryRecord>_>
          *index,double rtol)

{
  pointer pDVar1;
  range_difference_t<ranges::split_view<ranges::ref_view<const_std::__cxx11::basic_string<char>_>,_ranges::single_view<char>_>_>
  rVar2;
  
  BaseWithoutMT<njoy::ENDFtk::section::Type<1,_451>_>::BaseWithoutMT
            (&this->super_BaseWithoutMT<njoy::ENDFtk::section::Type<1,_451>_>,zaid,awr);
  this->lrp_ = lrp;
  this->lfi_ = lfi;
  this->nlib_ = nlib;
  this->nmod_ = nmod;
  rVar2 = ranges::distance_fn::
          impl_r<ranges::split_view<ranges::ref_view<std::__cxx11::string_const>,ranges::single_view<char>>>
                    ();
  makeParameters(&this->parameters_,elis,sta,lis,liso,nfor,awi,emax,lrel,nsub,nver,temp,rtol,ldrv,
                 (int)rVar2,
                 (int)((ulong)((long)(index->
                                     super__Vector_base<njoy::ENDFtk::DirectoryRecord,_std::allocator<njoy::ENDFtk::DirectoryRecord>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(index->
                                    super__Vector_base<njoy::ENDFtk::DirectoryRecord,_std::allocator<njoy::ENDFtk::DirectoryRecord>_>
                                    )._M_impl.super__Vector_impl_data._M_start) >> 5));
  makeDescription(&this->description_,description);
  pDVar1 = (index->
           super__Vector_base<njoy::ENDFtk::DirectoryRecord,_std::allocator<njoy::ENDFtk::DirectoryRecord>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  (this->index_).
  super__Vector_base<njoy::ENDFtk::DirectoryRecord,_std::allocator<njoy::ENDFtk::DirectoryRecord>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (index->
       super__Vector_base<njoy::ENDFtk::DirectoryRecord,_std::allocator<njoy::ENDFtk::DirectoryRecord>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->index_).
  super__Vector_base<njoy::ENDFtk::DirectoryRecord,_std::allocator<njoy::ENDFtk::DirectoryRecord>_>.
  _M_impl.super__Vector_impl_data._M_finish = pDVar1;
  (this->index_).
  super__Vector_base<njoy::ENDFtk::DirectoryRecord,_std::allocator<njoy::ENDFtk::DirectoryRecord>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (index->
       super__Vector_base<njoy::ENDFtk::DirectoryRecord,_std::allocator<njoy::ENDFtk::DirectoryRecord>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (index->
  super__Vector_base<njoy::ENDFtk::DirectoryRecord,_std::allocator<njoy::ENDFtk::DirectoryRecord>_>)
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (index->
  super__Vector_base<njoy::ENDFtk::DirectoryRecord,_std::allocator<njoy::ENDFtk::DirectoryRecord>_>)
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (index->
  super__Vector_base<njoy::ENDFtk::DirectoryRecord,_std::allocator<njoy::ENDFtk::DirectoryRecord>_>)
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

Type( int zaid, double awr, int lrp, int lfi, int nlib, int nmod,
      double elis, double sta, int lis, int liso, int nfor,
      double awi, double emax, int lrel, int nsub, int nver,
      double temp, int ldrv,
      const std::string& description,
      std::vector< DirectoryRecord >&& index,
      double rtol = 0. ) :
  BaseWithoutMT( zaid, awr ), lrp_( lrp ), lfi_( lfi ), nlib_( nlib ), nmod_( nmod ),
  parameters_( makeParameters( elis, sta, lis, liso, nfor,
                               awi, emax, lrel, nsub, nver,
                               temp, rtol, ldrv,
                               ranges::cpp20::distance(
                                   ranges::cpp20::views::split( description, '\n' ) ),
                               index.size() ) ),
  description_( makeDescription( description ) ),
  index_( std::move( index ) ) {}